

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakHashtimes4.c
# Opt level: O1

HashReturn
Keccak_HashInitializetimes4
          (Keccak_HashInstancetimes4 *instance,uint rate,uint capacity,uint hashbitlen,
          uchar delimitedSuffix)

{
  HashReturn HVar1;
  undefined3 in_register_00000081;
  
  if (CONCAT31(in_register_00000081,delimitedSuffix) != 0) {
    HVar1 = KeccakWidth1600times4_SpongeInitialize(&instance->sponge,rate,capacity);
    if (HVar1 == KECCAK_SUCCESS) {
      instance->fixedOutputLength = hashbitlen;
      instance->delimitedSuffix = delimitedSuffix;
      HVar1 = KECCAK_SUCCESS;
    }
    return HVar1;
  }
  return KECCAK_FAIL;
}

Assistant:

HashReturn Keccak_HashInitializetimes4(Keccak_HashInstancetimes4 *instance, unsigned int rate, unsigned int capacity, unsigned int hashbitlen, unsigned char delimitedSuffix)
{
    HashReturn result;

    if (delimitedSuffix == 0)
        return KECCAK_FAIL;
    result = (HashReturn)KeccakWidth1600times4_SpongeInitialize(&instance->sponge, rate, capacity);
    if (result != KECCAK_SUCCESS)
        return result;
    instance->fixedOutputLength = hashbitlen;
    instance->delimitedSuffix = delimitedSuffix;
    return KECCAK_SUCCESS;
}